

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<kj::StringTree>::setCapacity(Vector<kj::StringTree> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::StringTree> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::StringTree> newBuilder;
  size_t newSize_local;
  Vector<kj::StringTree> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::StringTree>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::StringTree>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::StringTree>
            ((ArrayBuilder<kj::StringTree> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::StringTree>>(&this->builder);
  ArrayBuilder<kj::StringTree>::addAll<kj::ArrayBuilder<kj::StringTree>>
            ((ArrayBuilder<kj::StringTree> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::StringTree>>((ArrayBuilder<kj::StringTree> *)local_38);
  ArrayBuilder<kj::StringTree>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::StringTree>::~ArrayBuilder((ArrayBuilder<kj::StringTree> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }